

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b_bot.cpp
# Opt level: O0

void InitBotStuff(void)

{
  bool bVar1;
  PClass *this;
  AActor *pAVar2;
  PClassActor *pPVar3;
  AActor *a;
  uint i_1;
  AWeapon *w;
  PClass *cls;
  uint i;
  
  for (cls._4_4_ = 0; cls._4_4_ < 0x24; cls._4_4_ = cls._4_4_ + 1) {
    this = PClass::FindClass(InitBotStuff::botinits[cls._4_4_].type);
    if (((this != (PClass *)0x0) &&
        (bVar1 = PClass::IsDescendantOf(this,AWeapon::RegistrationInfo.MyClass), bVar1)) &&
       (pAVar2 = GetDefaultByType(this), pAVar2 != (AActor *)0x0)) {
      pAVar2[1].VisibleEndPitch.Degrees =
           (double)InitBotStuff::botinits[cls._4_4_].movecombatdist / 65536.0;
      *(uint *)((long)&pAVar2[1].snext + 4) =
           InitBotStuff::botinits[cls._4_4_].weaponflags | *(uint *)((long)&pAVar2[1].snext + 4);
      pPVar3 = PClass::FindActor(InitBotStuff::botinits[cls._4_4_].projectile);
      pAVar2[1].SpriteRotation.Degrees = (double)pPVar3;
    }
  }
  for (a._4_4_ = 0; a._4_4_ < 3; a._4_4_ = a._4_4_ + 1) {
    pAVar2 = GetDefaultByName(InitBotStuff::warnbotmissiles[a._4_4_]);
    if (pAVar2 != (AActor *)0x0) {
      TFlags<ActorFlag3,_unsigned_int>::operator|=(&pAVar2->flags3,MF3_WARNBOT);
    }
  }
  return;
}

Assistant:

void InitBotStuff()
{
	static struct BotInit
	{
		const char *type;
		int movecombatdist;
		int weaponflags;
		const char *projectile;
	} botinits[] = {

		{ "Pistol", 25000000, 0, NULL },
		{ "Shotgun", 24000000, 0, NULL },
		{ "SuperShotgun", 15000000, 0, NULL },
		{ "Chaingun", 27000000, 0, NULL },
		{ "RocketLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "Rocket" },
		{ "PlasmaRifle",  27000000, 0, "PlasmaBall" },
		{ "BFG9000", 10000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_BFG, "BFGBall" },
		{ "GoldWand", 25000000, 0, NULL },
		{ "GoldWandPowered", 25000000, 0, NULL },
		{ "Crossbow", 24000000, 0, "CrossbowFX1" },
		{ "CrossbowPowered", 24000000, 0, "CrossbowFX2" },
		{ "Blaster", 27000000, 0, NULL },
		{ "BlasterPowered", 27000000, 0, "BlasterFX1" },
		{ "SkullRod", 27000000, 0, "HornRodFX1" },
		{ "SkullRodPowered", 27000000, 0, "HornRodFX2" },
		{ "PhoenixRod", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhoenixFX1" },
		{ "Mace", 27000000, WIF_BOT_REACTION_SKILL_THING, "MaceFX2" },
		{ "MacePowered", 27000000, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MaceFX4" },
		{ "FWeapHammer", 22000000, 0, "HammerMissile" },
		{ "FWeapQuietus", 20000000, 0, "FSwordMissile" },
		{ "CWeapStaff", 25000000, 0, "CStaffMissile" },
		{ "CWeapFlane", 27000000, 0, "CFlameMissile" },
		{ "MWeapWand", 25000000, 0, "MageWandMissile" },
		{ "CWeapWraithverge", 22000000, 0, "HolyMissile" },
		{ "MWeapFrost", 19000000, 0, "FrostMissile" },
		{ "MWeapLightning", 23000000, 0, "LightningFloor" },
		{ "MWeapBloodscourge", 20000000, 0, "MageStaffFX2" },
		{ "StrifeCrossbow", 24000000, 0, "ElectricBolt" },
		{ "StrifeCrossbow2", 24000000, 0, "PoisonBolt" },
		{ "AssaultGun", 27000000, 0, NULL },
		{ "MiniMissileLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "MiniMissile" },
		{ "FlameThrower", 24000000, 0, "FlameMissile" },
		{ "Mauler", 15000000, 0, NULL },
		{ "Mauler2", 10000000, 0, "MaulerTorpedo" },
		{ "StrifeGrenadeLauncher", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "HEGrenade" },
		{ "StrifeGrenadeLauncher2", 18350080, WIF_BOT_REACTION_SKILL_THING|WIF_BOT_EXPLOSIVE, "PhosphorousGrenade" },
	};

	for(unsigned i=0;i<sizeof(botinits)/sizeof(botinits[0]);i++)
	{
		const PClass *cls = PClass::FindClass(botinits[i].type);
		if (cls != NULL && cls->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
		{
			AWeapon *w = (AWeapon*)GetDefaultByType(cls);
			if (w != NULL)
			{
				w->MoveCombatDist = botinits[i].movecombatdist/65536.;
				w->WeaponFlags |= botinits[i].weaponflags;
				w->ProjectileType = PClass::FindActor(botinits[i].projectile);
			}
		}
	}

	static const char *warnbotmissiles[] = { "PlasmaBall", "Ripper", "HornRodFX1" };
	for(unsigned i=0;i<countof(warnbotmissiles);i++)
	{
		AActor *a = GetDefaultByName (warnbotmissiles[i]);
		if (a != NULL)
		{
			a->flags3|=MF3_WARNBOT;
		}
	}
}